

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
revalidate_if_necessary
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t *bucket_index,KeyNode *node,TreeIterator *it)

{
  TableEntryPtr TVar1;
  ViewType k;
  bool bVar2;
  TableEntryPtr TVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  NodeAndBucket NVar4;
  NodeAndBucket res;
  NodeBase *l;
  TreeIterator *it_local;
  KeyNode *node_local;
  map_index_t *bucket_index_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  *bucket_index = (this->super_UntypedMapBase).num_buckets_ - 1 & *bucket_index;
  TVar1 = (this->super_UntypedMapBase).table_[*bucket_index];
  TVar3 = NodeToTableEntry(&node->super_NodeBase);
  if (TVar1 == TVar3) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = UntypedMapBase::TableEntryIsNonEmptyList(&this->super_UntypedMapBase,*bucket_index);
    if (bVar2) {
      res._8_8_ = TableEntryToNode((this->super_UntypedMapBase).table_[*bucket_index]);
      do {
        res._8_8_ = *(undefined8 *)res._8_8_;
        if ((KeyNode *)res._8_8_ == (KeyNode *)0x0) goto LAB_001c57e3;
      } while ((KeyNode *)res._8_8_ != node);
      this_local._7_1_ = true;
    }
    else {
LAB_001c57e3:
      this_00 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::key(node);
      k = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      NVar4 = FindHelper(this,k,it);
      *bucket_index = NVar4.bucket;
      this_local._7_1_ = UntypedMapBase::TableEntryIsList(&this->super_UntypedMapBase,*bucket_index)
      ;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool revalidate_if_necessary(map_index_t& bucket_index, KeyNode* node,
                               TreeIterator* it) const {
    // Force bucket_index to be in range.
    bucket_index &= (num_buckets_ - 1);
    // Common case: the bucket we think is relevant points to `node`.
    if (table_[bucket_index] == NodeToTableEntry(node)) return true;
    // Less common: the bucket is a linked list with node_ somewhere in it,
    // but not at the head.
    if (TableEntryIsNonEmptyList(bucket_index)) {
      auto* l = TableEntryToNode(table_[bucket_index]);
      while ((l = l->next) != nullptr) {
        if (l == node) {
          return true;
        }
      }
    }
    // Well, bucket_index_ still might be correct, but probably
    // not.  Revalidate just to be sure.  This case is rare enough that we
    // don't worry about potential optimizations, such as having a custom
    // find-like method that compares Node* instead of the key.
    auto res = FindHelper(node->key(), it);
    bucket_index = res.bucket;
    return TableEntryIsList(bucket_index);
  }